

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

Arg * __thiscall TCLAP::Arg::longID(Arg *this,string *valueId)

{
  bool bVar1;
  char cVar2;
  allocator local_1c1;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [54];
  allocator local_22;
  undefined1 local_21;
  string *valueId_local;
  Arg *this_local;
  string *id;
  
  local_21 = 0;
  valueId_local = valueId;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  bVar1 = std::operator!=(valueId + 8,"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(local_58,local_78);
    std::__cxx11::string::operator+=((string *)this,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_78);
    if (((byte)valueId[0x90] & 1) != 0) {
      cVar2 = delimiter();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,1,cVar2,&local_f9);
      std::operator+(local_d8,(char *)local_f8);
      std::operator+(local_b8,local_d8);
      std::operator+(local_98,(char *)local_b8);
      std::__cxx11::string::operator+=((string *)this,(string *)local_98);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    std::__cxx11::string::operator+=((string *)this,",  ");
  }
  nameStartString_abi_cxx11_();
  std::operator+(local_120,local_140);
  std::__cxx11::string::operator+=((string *)this,(string *)local_120);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_140);
  if (((byte)valueId[0x90] & 1) != 0) {
    cVar2 = delimiter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,1,cVar2,&local_1c1);
    std::operator+(local_1a0,(char *)local_1c0);
    std::operator+(local_180,local_1a0);
    std::operator+(local_160,(char *)local_180);
    std::__cxx11::string::operator+=((string *)this,(string *)local_160);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  return this;
}

Assistant:

inline std::string Arg::longID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
	{
		id += Arg::flagStartString() + _flag;

		if ( _valueRequired )
			id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

		id += ",  ";
	}

	id += Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

	return id;

}